

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesDOMParser.cpp
# Opt level: O3

InputSource * __thiscall
xercesc_4_0::XercesDOMParser::resolveEntity
          (XercesDOMParser *this,XMLResourceIdentifier *resourceIdentifier)

{
  EntityResolver *pEVar1;
  int iVar2;
  undefined4 extraout_var;
  InputSource *pIVar3;
  
  pEVar1 = this->fEntityResolver;
  if (pEVar1 != (EntityResolver *)0x0) {
    iVar2 = (*pEVar1->_vptr_EntityResolver[2])
                      (pEVar1,resourceIdentifier->fPublicId,resourceIdentifier->fSystemId,
                       pEVar1->_vptr_EntityResolver[2]);
    return (InputSource *)CONCAT44(extraout_var,iVar2);
  }
  if (this->fXMLEntityResolver != (XMLEntityResolver *)0x0) {
    pIVar3 = (InputSource *)(**(code **)(*(long *)this->fXMLEntityResolver + 0x10))();
    return pIVar3;
  }
  return (InputSource *)0x0;
}

Assistant:

InputSource*
XercesDOMParser::resolveEntity(XMLResourceIdentifier* resourceIdentifier)
{
    //
    //  Just map it to the SAX entity resolver. If there is not one installed,
    //  return a null pointer to cause the default resolution.
    //
    if (fEntityResolver)
        return fEntityResolver->resolveEntity(resourceIdentifier->getPublicId(),
                                                resourceIdentifier->getSystemId());
    if (fXMLEntityResolver)
        return fXMLEntityResolver->resolveEntity(resourceIdentifier);

    return 0;
}